

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject_p_p.h
# Opt level: O1

void __thiscall QObjectPrivate::ConnectionData::resizeSignalVector(ConnectionData *this,size_t size)

{
  __pointer_type __src;
  int iVar1;
  size_t sVar2;
  __pointer_type __dest;
  long lVar3;
  Connection *pCVar4;
  Connection *pCVar5;
  __pointer_type pSVar6;
  quintptr qVar7;
  size_t allocSize;
  bool bVar8;
  
  __src = (this->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b
          ._M_p;
  if ((__src == (__pointer_type)0x0) || (__src->allocated <= size)) {
    qVar7 = size + 7 & 0xfffffffffffffff8;
    if (size + 7 >> 0x3c == 0) {
      allocSize = qVar7 << 4 | 0x20;
      sVar2 = QtPrivate::expectedAllocSize(allocSize,0x10);
      if (sVar2 != 0) {
        qVar7 = (sVar2 - 0x10 >> 4) - 1;
        allocSize = (sVar2 - 0x10 & 0xfffffffffffffff0) + 0x10;
      }
    }
    else {
      allocSize = 0;
    }
    if (allocSize == 0) {
      __dest = (__pointer_type)0x0;
    }
    else {
      __dest = (__pointer_type)malloc(allocSize);
    }
    if (__src == (__pointer_type)0x0) {
      iVar1 = -1;
    }
    else {
      memcpy(__dest,__src,__src->allocated * 0x10 + 0x20);
      iVar1 = (int)__src->allocated;
    }
    if (iVar1 < (int)qVar7) {
      lVar3 = (long)(int)qVar7 - (long)iVar1;
      pSVar6 = __dest + (long)iVar1 + 2;
      do {
        (pSVar6->super_ConnectionOrSignalVector).field_0.next = (Connection *)0x0;
        pSVar6->allocated = 0;
        pSVar6 = pSVar6 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    (__dest->super_ConnectionOrSignalVector).field_0.next = (Connection *)0x0;
    __dest->allocated = qVar7;
    (this->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b._M_p
         = __dest;
    if (__src != (__pointer_type)0x0) {
      pCVar4 = (Connection *)(this->orphaned)._M_i.c;
      do {
        (__src->super_ConnectionOrSignalVector).field_0.next = pCVar4;
        LOCK();
        pCVar5 = (Connection *)(this->orphaned)._M_i.c;
        bVar8 = pCVar4 == pCVar5;
        if (bVar8) {
          (this->orphaned)._M_i.c = (ulong)__src | 1;
          pCVar5 = pCVar4;
        }
        UNLOCK();
        pCVar4 = pCVar5;
      } while (!bVar8);
    }
  }
  return;
}

Assistant:

void resizeSignalVector(size_t size)
    {
        SignalVector *vector = this->signalVector.loadRelaxed();
        if (vector && vector->allocated > size)
            return;
        size = (size + 7) & ~7;
        void *ptr = QtPrivate::fittedMalloc(sizeof(SignalVector), &size, sizeof(ConnectionList), 1);
        auto newVector = new (ptr) SignalVector;

        int start = -1;
        if (vector) {
            // not (yet) existing trait:
            // static_assert(std::is_relocatable_v<SignalVector>);
            // static_assert(std::is_relocatable_v<ConnectionList>);
            memcpy(newVector, vector,
                   sizeof(SignalVector) + (vector->allocated + 1) * sizeof(ConnectionList));
            start = vector->count();
        }
        for (int i = start; i < int(size); ++i)
            new (&newVector->at(i)) ConnectionList();
        newVector->next = nullptr;
        newVector->allocated = size;

        signalVector.storeRelaxed(newVector);
        if (vector) {
            TaggedSignalVector o = nullptr;
            /* No ABA issue here: When adding a node, we only care about the list head, it doesn't
             * matter if the tail changes.
             */
            o = orphaned.load(std::memory_order_acquire);
            do {
                vector->nextInOrphanList = o;
            } while (!orphaned.compare_exchange_strong(o, TaggedSignalVector(vector), std::memory_order_release));
        }
    }